

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O2

Cut_Cut_t * Cut_CutMergeTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Cut_Cut_t *pCVar7;
  Cut_Cut_t *pCVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar13 = *(uint *)pCut0 >> 0x1c;
  uVar14 = *(uint *)pCut1 >> 0x1c;
  if (uVar13 < uVar14) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                  ,0xb1,"Cut_Cut_t *Cut_CutMergeTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar3 = p->pParams->nVarsMax;
  if (uVar14 == uVar3 && uVar13 == uVar3) {
    pCVar7 = (Cut_Cut_t *)0x0;
    uVar9 = 0;
    do {
      if (uVar13 == uVar9) {
        pCVar7 = Cut_CutAlloc(p);
        for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
          *(undefined4 *)(&pCVar7[1].field_0x0 + uVar9 * 4) =
               *(undefined4 *)(&pCut0[1].field_0x0 + uVar9 * 4);
        }
        goto LAB_00701eb4;
      }
      lVar1 = uVar9 * 4;
      lVar2 = uVar9 * 4;
      uVar9 = uVar9 + 1;
    } while (*(int *)(&pCut0[1].field_0x0 + lVar1) == *(int *)(&pCut1[1].field_0x0 + lVar2));
  }
  else if (uVar13 == uVar3) {
    for (uVar9 = 0; uVar10 = (ulong)(*(uint *)pCut0 >> 0x1c), uVar9 != uVar14; uVar9 = uVar9 + 1) {
      do {
        if ((long)uVar10 < 1) {
          return (Cut_Cut_t *)0x0;
        }
        lVar1 = uVar10 * 4;
        uVar10 = uVar10 - 1;
      } while (*(int *)((long)&pCut0->pNext + lVar1 + 4) !=
               *(int *)(&pCut1[1].field_0x0 + uVar9 * 4));
    }
    pCVar7 = Cut_CutAlloc(p);
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined4 *)(&pCVar7[1].field_0x0 + uVar9 * 4) =
           *(undefined4 *)(&pCut0[1].field_0x0 + uVar9 * 4);
    }
LAB_00701eb4:
    *(uint *)pCVar7 = *(uint *)pCVar7 & 0xfffffff | *(uint *)pCut0 & 0xf0000000;
  }
  else {
    pCVar8 = p->pReady;
    if (pCVar8 == (Cut_Cut_t *)0x0) {
      pCVar8 = Cut_CutAlloc(p);
      p->pReady = pCVar8;
    }
    iVar6 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar11 = 0;
    uVar9 = 0;
    for (uVar10 = 0; uVar12 = (uint)uVar9, uVar3 != uVar10; uVar10 = uVar10 + 1) {
      if (uVar12 == uVar14) {
        if (uVar11 == uVar13) {
          *(uint *)pCVar8 = (*(uint *)pCVar8 & 0xfffffff) - iVar6;
          goto LAB_00701e8a;
        }
        *(uint *)((long)&pCVar8[1].field_0x0 + uVar10 * 4) =
             *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar11 * 4);
        uVar9 = (ulong)uVar14;
        uVar11 = uVar11 + 1;
      }
      else if (uVar11 == uVar13) {
        uVar9 = (ulong)(uVar12 + 1);
        *(uint *)((long)&pCVar8[1].field_0x0 + uVar10 * 4) =
             *(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar12 * 4);
        uVar11 = uVar13;
      }
      else {
        uVar4 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar11 * 4);
        uVar5 = *(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar12 * 4);
        if ((int)uVar4 < (int)uVar5) {
          uVar11 = uVar11 + 1;
          *(uint *)((long)&pCVar8[1].field_0x0 + uVar10 * 4) = uVar4;
        }
        else if ((int)uVar5 < (int)uVar4) {
          uVar9 = (ulong)(uVar12 + 1);
          *(uint *)((long)&pCVar8[1].field_0x0 + uVar10 * 4) = uVar5;
        }
        else {
          uVar11 = uVar11 + 1;
          *(uint *)((long)&pCVar8[1].field_0x0 + uVar10 * 4) = uVar4;
          uVar9 = (ulong)(uVar12 + 1);
        }
      }
      iVar6 = iVar6 + -0x10000000;
    }
    pCVar7 = (Cut_Cut_t *)0x0;
    if (((int)uVar13 <= (int)uVar11) && (pCVar7 = (Cut_Cut_t *)0x0, (int)uVar14 <= (int)uVar12)) {
      *(uint *)pCVar8 = *(uint *)pCVar8 & 0xfffffff | uVar3 << 0x1c;
LAB_00701e8a:
      pCVar7 = p->pReady;
      p->pReady = (Cut_Cut_t *)0x0;
    }
  }
  return pCVar7;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // consider two cuts
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}